

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O3

int mbedtls_aes_cmac_prf_128(uchar *key,size_t key_length,uchar *input,size_t in_len,uchar *output)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  uchar auStack_58 [8];
  uchar zero_key [16];
  uchar int_key [16];
  
  if (output == (uchar *)0x0 || (input == (uchar *)0x0 || key == (uchar *)0x0)) {
    return -0x6100;
  }
  cipher_info = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_ECB);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    iVar1 = -0x6080;
  }
  else {
    if (key_length == 0x10) {
      zero_key._8_8_ = *(undefined8 *)key;
    }
    else {
      auStack_58[0] = '\0';
      auStack_58[1] = '\0';
      auStack_58[2] = '\0';
      auStack_58[3] = '\0';
      auStack_58[4] = '\0';
      auStack_58[5] = '\0';
      auStack_58[6] = '\0';
      auStack_58[7] = '\0';
      zero_key[0] = '\0';
      zero_key[1] = '\0';
      zero_key[2] = '\0';
      zero_key[3] = '\0';
      zero_key[4] = '\0';
      zero_key[5] = '\0';
      zero_key[6] = '\0';
      zero_key[7] = '\0';
      iVar1 = mbedtls_cipher_cmac(cipher_info,auStack_58,0x80,key,key_length,zero_key + 8);
      if (iVar1 != 0) goto LAB_00214ce5;
    }
    iVar1 = mbedtls_cipher_cmac(cipher_info,zero_key + 8,0x80,input,in_len,output);
  }
LAB_00214ce5:
  mbedtls_platform_zeroize(zero_key + 8,0x10);
  return iVar1;
}

Assistant:

int mbedtls_aes_cmac_prf_128(const unsigned char *key, size_t key_length,
                             const unsigned char *input, size_t in_len,
                             unsigned char output[16])
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_cipher_info_t *cipher_info;
    unsigned char zero_key[MBEDTLS_AES_BLOCK_SIZE];
    unsigned char int_key[MBEDTLS_AES_BLOCK_SIZE];

    if (key == NULL || input == NULL || output == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cipher_info = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_ECB);
    if (cipher_info == NULL) {
        /* Failing at this point must be due to a build issue */
        ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
        goto exit;
    }

    if (key_length == MBEDTLS_AES_BLOCK_SIZE) {
        /* Use key as is */
        memcpy(int_key, key, MBEDTLS_AES_BLOCK_SIZE);
    } else {
        memset(zero_key, 0, MBEDTLS_AES_BLOCK_SIZE);

        ret = mbedtls_cipher_cmac(cipher_info, zero_key, 128, key,
                                  key_length, int_key);
        if (ret != 0) {
            goto exit;
        }
    }

    ret = mbedtls_cipher_cmac(cipher_info, int_key, 128, input, in_len,
                              output);

exit:
    mbedtls_platform_zeroize(int_key, sizeof(int_key));

    return ret;
}